

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O3

ShadersAndProgram __thiscall
deqp::gles2::Performance::ShaderCompilerCase::createShadersAndProgram(ShaderCompilerCase *this)

{
  int iVar1;
  undefined4 uVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  ShadersAndProgram SVar5;
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  SVar5.vertShader = (**(code **)(lVar4 + 0x3f0))(0x8b31);
  uVar2 = (**(code **)(lVar4 + 0x3f0))(0x8b30);
  dVar3 = (**(code **)(lVar4 + 0x3c8))();
  (**(code **)(lVar4 + 0x10))(dVar3,SVar5.vertShader);
  (**(code **)(lVar4 + 0x10))(dVar3,uVar2);
  SVar5.fragShader = uVar2;
  SVar5.program = dVar3;
  return SVar5;
}

Assistant:

ShaderCompilerCase::ShadersAndProgram ShaderCompilerCase::createShadersAndProgram (void) const
{
	const glw::Functions&	gl = m_context.getRenderContext().getFunctions();
	ShadersAndProgram		result;

	result.vertShader	= gl.createShader(GL_VERTEX_SHADER);
	result.fragShader	= gl.createShader(GL_FRAGMENT_SHADER);
	result.program		= gl.createProgram();

	gl.attachShader(result.program, result.vertShader);
	gl.attachShader(result.program, result.fragShader);

	return result;
}